

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall cppcms::json::value::at(value *this,char *cpath,value *v)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
  *this_00;
  iterator iVar3;
  _Alloc_hider _Var4;
  bad_value_cast *this_01;
  char *pcVar5;
  size_t pos;
  pair<std::_Rb_tree_iterator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_bool>
  pVar6;
  string_key path;
  value local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
  local_b8;
  undefined8 local_90;
  value *local_88;
  string_key part;
  string local_50;
  
  path.end_ = cpath + -1;
  do {
    pcVar5 = path.end_ + 1;
    path.end_ = path.end_ + 1;
  } while (*pcVar5 != '\0');
  path.key_._M_dataplus._M_p = (pointer)&path.key_.field_2;
  path.key_._M_string_length = 0;
  path.key_.field_2._M_local_buf[0] = '\0';
  pos = 0;
  path.begin_ = cpath;
  local_88 = v;
  do {
    sVar2 = string_key::find(&path,'.',pos);
    string_key::unowned_substr(&part,&path,pos,sVar2 - pos);
    _Var4._M_p = part.begin_;
    pcVar5 = part.end_;
    if (part.begin_ == (char *)0x0) {
      _Var4 = part.key_._M_dataplus;
      pcVar5 = part.key_._M_dataplus._M_p + part.key_._M_string_length;
    }
    if (pcVar5 == _Var4._M_p) {
      this_01 = (bad_value_cast *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string
                ((string *)&local_b8,"Invalid path provided",(allocator *)&local_50);
      bad_value_cast::bad_value_cast(this_01,&local_b8.first);
      __cxa_throw(this_01,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
    }
    if (*(int *)&(*(_Base_ptr *)this)[1]._M_left != 5) {
      local_b8.first._M_dataplus._M_p = (pointer)0x0;
      local_b8.first._M_string_length = 0;
      local_b8.first.field_2._M_allocated_capacity = 0;
      local_b8.first.field_2._8_8_ = &local_b8.first._M_string_length;
      local_90 = 0;
      local_b8.second.d.d.ptr_ = (copyable)(copyable)local_b8.first.field_2._8_8_;
      value<std::map<cppcms::string_key,cppcms::json::value,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>>
                ((value *)&local_50,
                 (map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                  *)&local_b8);
      p_Var1 = *(_Base_ptr *)this;
      *this = (value)local_50._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)p_Var1;
      booster::copy_ptr<cppcms::json::value::_data>::~copy_ptr
                ((copy_ptr<cppcms::json::value::_data> *)&local_50);
      std::
      _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
      ::~_Rb_tree((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                   *)&local_b8);
    }
    this_00 = (_Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
               *)object(this);
    iVar3 = std::
            _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::find((_Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                    *)this_00,&part);
    if (iVar3._M_node == (_Base_ptr)(this_00 + 8)) {
      string_key::str_abi_cxx11_(&local_50,&part);
      copyable::copyable(&local_c0.d);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value,_true>
                (&local_b8,&local_50,&local_c0);
      pVar6 = std::
              _Rb_tree<cppcms::string_key,std::pair<cppcms::string_key_const,cppcms::json::value>,std::_Select1st<std::pair<cppcms::string_key_const,cppcms::json::value>>,std::less<cppcms::string_key>,std::allocator<std::pair<cppcms::string_key_const,cppcms::json::value>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,cppcms::json::value>>
                        (this_00,&local_b8);
      iVar3._M_node = (_Base_ptr)pVar6.first._M_node;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::json::value>
      ::~pair(&local_b8);
      booster::copy_ptr<cppcms::json::value::_data>::~copy_ptr
                ((copy_ptr<cppcms::json::value::_data> *)&local_c0);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&part.key_);
    _Var4._M_p = path.begin_;
    pcVar5 = path.end_;
    if (path.begin_ == (char *)0x0) {
      _Var4 = path.key_._M_dataplus;
      pcVar5 = path.key_._M_dataplus._M_p + path.key_._M_string_length;
    }
    this = (value *)&iVar3._M_node[2]._M_left;
  } while ((sVar2 != 0xffffffffffffffff) &&
          (pos = sVar2 + 1, pos < (ulong)((long)pcVar5 - (long)_Var4._M_p)));
  copyable::operator=((copyable *)this,&local_88->d);
  std::__cxx11::string::~string((string *)&path.key_);
  return;
}

Assistant:

void value::at(char const *cpath,value const &v)
	{
		string_key path=string_key::unowned(cpath);
		value *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key part=path.unowned_substr(pos,new_pos - pos);


			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				throw bad_value_cast("Invalid path provided");
			if(ptr->type()!=json::is_object) {
				*ptr=json::object();
			}
			json::object &obj=ptr->object();
			json::object::iterator p;
			if((p=obj.find(part))==obj.end()) {
				ptr=&obj.insert(std::make_pair(part.str(),json::value())).first->second;
			}
			else
				ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		*ptr=v;
	}